

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O2

int testUpwardPass(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  FeatureType *pFVar3;
  ArrayFeatureType *this;
  ArrayFeatureType_ShapeRange *pAVar4;
  SizeRange *pSVar5;
  NeuralNetwork *pNVar6;
  NeuralNetworkLayer *pNVar7;
  ConvolutionLayerParams *this_00;
  WeightParams *pWVar8;
  InnerProductLayerParams *this_01;
  ShapeConstraint *this_02;
  ShapeRange *pSVar9;
  size_t sVar10;
  ostream *poVar11;
  int iVar12;
  char *pcVar13;
  bool bVar14;
  RangeValue RVar15;
  allocator local_d1;
  string local_d0;
  Model m1;
  NeuralNetworkShaper shapes;
  
  CoreML::Specification::Model::Model(&m1);
  pMVar1 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->input_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pAVar4 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar4->sizeranges_);
  pSVar5->lowerbound_ = 4;
  pSVar5->upperbound_ = 4;
  pAVar4 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar4->sizeranges_);
  pSVar5->lowerbound_ = 1;
  pSVar5->upperbound_ = 1;
  pAVar4 = CoreML::Specification::ArrayFeatureType::mutable_shaperange(this);
  pSVar5 = google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::Add
                     (&pAVar4->sizeranges_);
  pSVar5->lowerbound_ = 1;
  pSVar5->upperbound_ = -1;
  pMVar1 = CoreML::Specification::Model::mutable_description(&m1);
  pFVar2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                     (&pMVar1->output_);
  CoreML::Specification::FeatureDescription::set_name(pFVar2,"output");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  pNVar6 = CoreML::Specification::Model::mutable_neuralnetwork(&m1);
  pNVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar7,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar7,"conv_out");
  this_00 = CoreML::Specification::NeuralNetworkLayer::mutable_convolution(pNVar7);
  this_00->outputchannels_ = 5;
  this_00->kernelchannels_ = 4;
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_00,1);
  CoreML::Specification::ConvolutionLayerParams::add_kernelsize(this_00,10);
  CoreML::Specification::ConvolutionLayerParams::mutable_valid(this_00);
  this_00->hasbias_ = false;
  iVar12 = 200;
  while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
    pWVar8 = CoreML::Specification::ConvolutionLayerParams::mutable_weights(this_00);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar8,1.0);
  }
  pNVar7 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::Add
                     (&pNVar6->layers_);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar7,"conv_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar7,"output");
  this_01 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar7);
  this_01->inputchannels_ = 5;
  this_01->outputchannels_ = 1;
  this_01->hasbias_ = false;
  iVar12 = 5;
  while (bVar14 = iVar12 != 0, iVar12 = iVar12 + -1, bVar14) {
    pWVar8 = CoreML::Specification::InnerProductLayerParams::mutable_weights(this_01);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar8,1.0);
  }
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper(&shapes,&m1,true);
  std::__cxx11::string::string((string *)&local_d0,"input",&local_d1);
  this_02 = CoreML::NeuralNetworkShaper::shape(&shapes,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  pSVar9 = CoreML::ShapeConstraint::sequenceRange(this_02);
  sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
  if (sVar10 == 0) {
    pSVar9 = CoreML::ShapeConstraint::sequenceRange(this_02);
    RVar15 = CoreML::ShapeRange::maximumValue(pSVar9);
    local_d0._M_string_length = RVar15._val;
    local_d0._M_dataplus._M_p._0_1_ = RVar15._isUnbound;
    bVar14 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d0);
    if (bVar14) {
      pSVar9 = CoreML::ShapeConstraint::batchRange(this_02);
      sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
      if (sVar10 == 0) {
        pSVar9 = CoreML::ShapeConstraint::batchRange(this_02);
        RVar15 = CoreML::ShapeRange::maximumValue(pSVar9);
        local_d0._M_string_length = RVar15._val;
        local_d0._M_dataplus._M_p._0_1_ = RVar15._isUnbound;
        bVar14 = CoreML::RangeValue::isUnbound((RangeValue *)&local_d0);
        if (bVar14) {
          pSVar9 = CoreML::ShapeConstraint::channelRange(this_02);
          sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
          if (sVar10 == 4) {
            pSVar9 = CoreML::ShapeConstraint::channelRange(this_02);
            RVar15 = CoreML::ShapeRange::maximumValue(pSVar9);
            local_d0._M_string_length = RVar15._val;
            local_d0._M_dataplus._M_p._0_1_ = RVar15._isUnbound;
            sVar10 = CoreML::RangeValue::value((RangeValue *)&local_d0);
            if (sVar10 == 4) {
              pSVar9 = CoreML::ShapeConstraint::heightRange(this_02);
              sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
              if (sVar10 == 1) {
                pSVar9 = CoreML::ShapeConstraint::heightRange(this_02);
                RVar15 = CoreML::ShapeRange::maximumValue(pSVar9);
                local_d0._M_string_length = RVar15._val;
                local_d0._M_dataplus._M_p._0_1_ = RVar15._isUnbound;
                sVar10 = CoreML::RangeValue::value((RangeValue *)&local_d0);
                if (sVar10 == 1) {
                  pSVar9 = CoreML::ShapeConstraint::widthRange(this_02);
                  sVar10 = CoreML::ShapeRange::minimumValue(pSVar9);
                  if (sVar10 == 10) {
                    pSVar9 = CoreML::ShapeConstraint::widthRange(this_02);
                    RVar15 = CoreML::ShapeRange::maximumValue(pSVar9);
                    local_d0._M_string_length = RVar15._val;
                    local_d0._M_dataplus._M_p._0_1_ = RVar15._isUnbound;
                    sVar10 = CoreML::RangeValue::value((RangeValue *)&local_d0);
                    iVar12 = 0;
                    if (sVar10 == 10) goto LAB_00139b31;
                    poVar11 = std::operator<<((ostream *)&std::cout,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             );
                    poVar11 = std::operator<<(poVar11,":");
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x14d);
                    poVar11 = std::operator<<(poVar11,": error: ");
                    pcVar13 = "inShape.widthRange().maximumValue().value() == 10";
                  }
                  else {
                    poVar11 = std::operator<<((ostream *)&std::cout,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                             );
                    poVar11 = std::operator<<(poVar11,":");
                    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x14c);
                    poVar11 = std::operator<<(poVar11,": error: ");
                    pcVar13 = "inShape.widthRange().minimumValue() == 10";
                  }
                }
                else {
                  poVar11 = std::operator<<((ostream *)&std::cout,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                           );
                  poVar11 = std::operator<<(poVar11,":");
                  poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x14a);
                  poVar11 = std::operator<<(poVar11,": error: ");
                  pcVar13 = "inShape.heightRange().maximumValue().value() == 1";
                }
              }
              else {
                poVar11 = std::operator<<((ostream *)&std::cout,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                         );
                poVar11 = std::operator<<(poVar11,":");
                poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x149);
                poVar11 = std::operator<<(poVar11,": error: ");
                pcVar13 = "inShape.heightRange().minimumValue() == 1";
              }
            }
            else {
              poVar11 = std::operator<<((ostream *)&std::cout,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                       );
              poVar11 = std::operator<<(poVar11,":");
              poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x147);
              poVar11 = std::operator<<(poVar11,": error: ");
              pcVar13 = "inShape.channelRange().maximumValue().value() == 4";
            }
          }
          else {
            poVar11 = std::operator<<((ostream *)&std::cout,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                     );
            poVar11 = std::operator<<(poVar11,":");
            poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x146);
            poVar11 = std::operator<<(poVar11,": error: ");
            pcVar13 = "inShape.channelRange().minimumValue() == 4";
          }
        }
        else {
          poVar11 = std::operator<<((ostream *)&std::cout,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                   );
          poVar11 = std::operator<<(poVar11,":");
          poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x144);
          poVar11 = std::operator<<(poVar11,": error: ");
          pcVar13 = "inShape.batchRange().maximumValue().isUnbound()";
        }
      }
      else {
        poVar11 = std::operator<<((ostream *)&std::cout,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                                 );
        poVar11 = std::operator<<(poVar11,":");
        poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x143);
        poVar11 = std::operator<<(poVar11,": error: ");
        pcVar13 = "inShape.batchRange().minimumValue() == 0";
      }
    }
    else {
      poVar11 = std::operator<<((ostream *)&std::cout,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               );
      poVar11 = std::operator<<(poVar11,":");
      poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x141);
      poVar11 = std::operator<<(poVar11,": error: ");
      pcVar13 = "inShape.sequenceRange().maximumValue().isUnbound()";
    }
  }
  else {
    poVar11 = std::operator<<((ostream *)&std::cout,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             );
    poVar11 = std::operator<<(poVar11,":");
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)poVar11,0x140);
    poVar11 = std::operator<<(poVar11,": error: ");
    pcVar13 = "inShape.sequenceRange().minimumValue() == 0";
  }
  poVar11 = std::operator<<(poVar11,pcVar13);
  poVar11 = std::operator<<(poVar11," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar11);
  iVar12 = 1;
LAB_00139b31:
  CoreML::NeuralNetworkShaper::~NeuralNetworkShaper(&shapes);
  CoreML::Specification::Model::~Model(&m1);
  return iVar12;
}

Assistant:

int testUpwardPass() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(1);
    shape2->set_upperbound(1);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(1);
    shape3->set_upperbound(-1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("conv_out");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(1);
    convParams->add_kernelsize(10);
    convParams->mutable_valid();
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*10; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    Specification::NeuralNetworkLayer *ipLayer = nn->add_layers();
    ipLayer->add_input("conv_out");
    ipLayer->add_output("output");
    Specification::InnerProductLayerParams *ipParams = ipLayer->mutable_innerproduct();
    ipParams->set_inputchannels(5);
    ipParams->set_outputchannels(1);
    ipParams->set_hasbias(false);
    for (int i = 0; i < 5; i++) {
        ipParams->mutable_weights()->add_floatvalue(1.0);
    }

    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());

    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 1);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 1);

    ML_ASSERT(inShape.widthRange().minimumValue() == 10);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 10);
    
    return 0;
    
}